

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

Expression * __thiscall
wasm::OptimizeInstructions::optimizeBoolean(OptimizeInstructions *this,Expression *boolean)

{
  bool bVar1;
  bool bVar2;
  BinaryOp BVar3;
  int32_t iVar4;
  Index bits;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  Block *curr;
  Expression *pEVar6;
  size_t sVar7;
  Expression **ppEVar8;
  bool local_149;
  uint local_140;
  BasicType local_13c;
  Index i;
  Try *tryy;
  Select *select;
  If *local_120;
  If *iff;
  Block *local_110;
  Block *block;
  Expression *ext;
  Literal local_f8;
  Literal local_e0;
  Literal local_c8;
  Type local_b0;
  Literal local_a8;
  byte local_79;
  Literal local_78;
  Const *local_60;
  Const *c_2;
  Const *c_1;
  Const *c;
  Binary *binary_1;
  Binary *pBStack_38;
  BinaryOp op;
  Binary *binary;
  Unary *unary2;
  Unary *unary;
  Expression *boolean_local;
  OptimizeInstructions *this_local;
  
  unary = (Unary *)boolean;
  boolean_local = (Expression *)this;
  unary2 = Expression::dynCast<wasm::Unary>(boolean);
  if (unary2 == (Unary *)0x0) {
    c = (Const *)Expression::dynCast<wasm::Binary>((Expression *)unary);
    if ((Binary *)c == (Binary *)0x0) {
      local_110 = Expression::dynCast<wasm::Block>((Expression *)unary);
      if (local_110 == (Block *)0x0) {
        local_120 = Expression::dynCast<wasm::If>((Expression *)unary);
        if (local_120 == (If *)0x0) {
          tryy = (Try *)Expression::dynCast<wasm::Select>((Expression *)unary);
          if (tryy == (Try *)0x0) {
            _i = Expression::dynCast<wasm::Try>((Expression *)unary);
            if (_i != (Try *)0x0) {
              local_13c = i32;
              bVar1 = wasm::Type::operator==
                                (&(_i->super_SpecificExpression<(wasm::Expression::Id)52>).
                                  super_Expression.type,&local_13c);
              if (bVar1) {
                pEVar6 = optimizeBoolean(this,_i->body);
                _i->body = pEVar6;
                for (local_140 = 0;
                    sVar7 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                            size(&(_i->catchBodies).
                                  super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                ), local_140 < sVar7; local_140 = local_140 + 1) {
                  ppEVar8 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                            operator[](&(_i->catchBodies).
                                        super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                       ,(ulong)local_140);
                  pEVar6 = optimizeBoolean(this,*ppEVar8);
                  ppEVar8 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::
                            operator[](&(_i->catchBodies).
                                        super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                                       ,(ulong)local_140);
                  *ppEVar8 = pEVar6;
                }
              }
            }
          }
          else {
            pEVar6 = optimizeBoolean(this,(Expression *)(tryy->name).super_IString.str._M_len);
            (tryy->name).super_IString.str._M_len = (size_t)pEVar6;
            pEVar6 = optimizeBoolean(this,(Expression *)(tryy->name).super_IString.str._M_str);
            (tryy->name).super_IString.str._M_str = (char *)pEVar6;
          }
        }
        else {
          select._4_4_ = 2;
          bVar1 = wasm::Type::operator==
                            (&(local_120->super_SpecificExpression<(wasm::Expression::Id)2>).
                              super_Expression.type,(BasicType *)((long)&select + 4));
          if (bVar1) {
            pEVar6 = optimizeBoolean(this,local_120->ifTrue);
            local_120->ifTrue = pEVar6;
            pEVar6 = optimizeBoolean(this,local_120->ifFalse);
            local_120->ifFalse = pEVar6;
          }
        }
      }
      else {
        iff._4_4_ = 2;
        bVar2 = wasm::Type::operator==
                          (&(local_110->super_SpecificExpression<(wasm::Expression::Id)1>).
                            super_Expression.type,(BasicType *)((long)&iff + 4));
        bVar1 = false;
        if (bVar2) {
          sVar7 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                            (&(local_110->list).
                              super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                            );
          bVar1 = sVar7 != 0;
        }
        if (bVar1) {
          ppEVar8 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                              (&(local_110->list).
                                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                              );
          pEVar6 = optimizeBoolean(this,*ppEVar8);
          ppEVar8 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::back
                              (&(local_110->list).
                                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                              );
          *ppEVar8 = pEVar6;
        }
      }
    }
    else {
      if (((Binary *)c)->op == SubInt32) {
        c_1 = Expression::dynCast<wasm::Const>(((Binary *)c)->left);
        if ((c_1 != (Const *)0x0) && (iVar4 = wasm::Literal::geti32(&c_1->value), iVar4 == 0)) {
          return (Expression *)(c->value).type.id;
        }
      }
      else if (((Binary *)c)->op == OrInt32) {
        p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 optimizeBoolean(this,((Binary *)c)->left);
        (c->value).field_0.gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = p_Var5;
        pEVar6 = optimizeBoolean(this,(Expression *)(c->value).type.id);
        (c->value).type.id = (uintptr_t)pEVar6;
      }
      else if (((Binary *)c)->op == NeInt32) {
        c_2 = Expression::dynCast<wasm::Const>(((Binary *)c)->right);
        if ((c_2 != (Const *)0x0) && (iVar4 = wasm::Literal::geti32(&c_2->value), iVar4 == 0)) {
          return (Expression *)
                 (c->value).field_0.gcData.
                 super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        }
      }
      else if ((((Binary *)c)->op == RemSInt32) &&
              (local_60 = Expression::dynCast<wasm::Const>(((Binary *)c)->right),
              local_60 != (Const *)0x0)) {
        bVar1 = wasm::Literal::isSignedMin(&local_60->value);
        local_79 = 0;
        local_149 = true;
        if (!bVar1) {
          wasm::Literal::abs(&local_78,(int)local_60 + 0x10);
          local_79 = 1;
          iVar4 = wasm::Literal::geti32(&local_78);
          local_149 = Bits::isPowerOf2<int>(iVar4);
        }
        if ((local_79 & 1) != 0) {
          wasm::Literal::~Literal(&local_78);
        }
        if (local_149 != false) {
          (c->value).field_0.i32 = 7;
          bVar1 = wasm::Literal::isSignedMin(&local_60->value);
          if (bVar1) {
            wasm::Type::Type(&local_b0,i32);
            wasm::Literal::makeSignedMax(&local_a8,local_b0);
            wasm::Literal::operator=(&local_60->value,&local_a8);
            wasm::Literal::~Literal(&local_a8);
          }
          else {
            wasm::Literal::abs(&local_e0,(int)local_60 + 0x10);
            wasm::Type::Type((Type *)&ext,i32);
            wasm::Literal::makeOne(&local_f8,(Type)ext);
            wasm::Literal::sub(&local_c8,&local_e0,&local_f8);
            wasm::Literal::operator=(&local_60->value,&local_c8);
            wasm::Literal::~Literal(&local_c8);
            wasm::Literal::~Literal(&local_f8);
            wasm::Literal::~Literal(&local_e0);
          }
          return (Expression *)c;
        }
      }
      curr = (Block *)Properties::getSignExtValue((Expression *)c);
      if (curr != (Block *)0x0) {
        block = curr;
        bits = Properties::getSignExtBits((Expression *)c);
        pEVar6 = makeZeroExt(this,(Expression *)curr,bits);
        return pEVar6;
      }
    }
  }
  else if ((unary2 != (Unary *)0x0) && (unary2->op == EqZInt32)) {
    binary = (Binary *)Expression::dynCast<wasm::Unary>(unary2->value);
    if ((binary != (Binary *)0x0) && (binary->op == EqZInt32)) {
      return binary->left;
    }
    pBStack_38 = Expression::dynCast<wasm::Binary>(unary2->value);
    if ((pBStack_38 != (Binary *)0x0) &&
       (BVar3 = invertBinaryOp(this,*(BinaryOp *)
                                     &((SpecificExpression<(wasm::Expression::Id)16> *)
                                      &pBStack_38->op)->super_Expression), BVar3 != InvalidBinary))
    {
      *(BinaryOp *)
       &((SpecificExpression<(wasm::Expression::Id)16> *)&pBStack_38->op)->super_Expression = BVar3;
      return (Expression *)pBStack_38;
    }
  }
  return (Expression *)unary;
}

Assistant:

Expression* optimizeBoolean(Expression* boolean) {
    // TODO use a general getFallthroughs
    if (auto* unary = boolean->dynCast<Unary>()) {
      if (unary) {
        if (unary->op == EqZInt32) {
          auto* unary2 = unary->value->dynCast<Unary>();
          if (unary2 && unary2->op == EqZInt32) {
            // double eqz
            return unary2->value;
          }
          if (auto* binary = unary->value->dynCast<Binary>()) {
            // !(x <=> y)   ==>   x <!=> y
            auto op = invertBinaryOp(binary->op);
            if (op != InvalidBinary) {
              binary->op = op;
              return binary;
            }
          }
        }
      }
    } else if (auto* binary = boolean->dynCast<Binary>()) {
      if (binary->op == SubInt32) {
        if (auto* c = binary->left->dynCast<Const>()) {
          if (c->value.geti32() == 0) {
            // bool(0 - x)   ==>   bool(x)
            return binary->right;
          }
        }
      } else if (binary->op == OrInt32) {
        // an or flowing into a boolean context can consider each input as
        // boolean
        binary->left = optimizeBoolean(binary->left);
        binary->right = optimizeBoolean(binary->right);
      } else if (binary->op == NeInt32) {
        if (auto* c = binary->right->dynCast<Const>()) {
          // x != 0 is just x if it's used as a bool
          if (c->value.geti32() == 0) {
            return binary->left;
          }
          // TODO: Perhaps use it for separate final pass???
          // x != -1   ==>    x ^ -1
          // if (num->value.geti32() == -1) {
          //   binary->op = XorInt32;
          //   return binary;
          // }
        }
      } else if (binary->op == RemSInt32) {
        // bool(i32(x) % C_pot)  ==>  bool(x & (C_pot - 1))
        // bool(i32(x) % min_s)  ==>  bool(x & max_s)
        if (auto* c = binary->right->dynCast<Const>()) {
          if (c->value.isSignedMin() ||
              Bits::isPowerOf2(c->value.abs().geti32())) {
            binary->op = AndInt32;
            if (c->value.isSignedMin()) {
              c->value = Literal::makeSignedMax(Type::i32);
            } else {
              c->value = c->value.abs().sub(Literal::makeOne(Type::i32));
            }
            return binary;
          }
        }
      }
      if (auto* ext = Properties::getSignExtValue(binary)) {
        // use a cheaper zero-extent, we just care about the boolean value
        // anyhow
        return makeZeroExt(ext, Properties::getSignExtBits(binary));
      }
    } else if (auto* block = boolean->dynCast<Block>()) {
      if (block->type == Type::i32 && block->list.size() > 0) {
        block->list.back() = optimizeBoolean(block->list.back());
      }
    } else if (auto* iff = boolean->dynCast<If>()) {
      if (iff->type == Type::i32) {
        iff->ifTrue = optimizeBoolean(iff->ifTrue);
        iff->ifFalse = optimizeBoolean(iff->ifFalse);
      }
    } else if (auto* select = boolean->dynCast<Select>()) {
      select->ifTrue = optimizeBoolean(select->ifTrue);
      select->ifFalse = optimizeBoolean(select->ifFalse);
    } else if (auto* tryy = boolean->dynCast<Try>()) {
      if (tryy->type == Type::i32) {
        tryy->body = optimizeBoolean(tryy->body);
        for (Index i = 0; i < tryy->catchBodies.size(); i++) {
          tryy->catchBodies[i] = optimizeBoolean(tryy->catchBodies[i]);
        }
      }
    }
    // TODO: recurse into br values?
    return boolean;
  }